

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O1

LY_ERR lyd_diff_apply_r(lyd_node **first_node,lyd_node *parent_node,lyd_node *diff_node,
                       lyd_diff_cb diff_cb,void *cb_data,ly_ht **dup_inst)

{
  lysc_node *plVar1;
  lyd_diff_cb diff_cb_00;
  void *cb_data_00;
  LY_ERR LVar2;
  lys_module *plVar3;
  char *__ptr;
  lyd_meta *plVar4;
  lyd_node *plVar5;
  lyd_node **first_node_00;
  uint uVar6;
  char *format;
  lyd_node_any *any;
  lysc_node **pplVar7;
  char *pcVar8;
  char *pcVar9;
  lyd_node *match;
  lyd_diff_op op;
  ly_ht *child_dup_inst;
  lyd_node *local_60;
  lyd_diff_cb local_58;
  ly_ctx *local_50;
  lyd_diff_op local_48;
  lyd_diff_op local_44;
  void *local_40;
  ly_ht *local_38;
  
  local_38 = (ly_ht *)0x0;
  if (diff_node->schema == (lysc_node *)0x0) {
    plVar3 = (lys_module *)&diff_node[2].schema;
  }
  else {
    plVar3 = diff_node->schema->module;
  }
  local_50 = plVar3->ctx;
  local_58 = diff_cb;
  local_40 = cb_data;
  LVar2 = lyd_diff_get_op(diff_node,&local_44);
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  plVar1 = diff_node->schema;
  if (((plVar1 == (lysc_node *)0x0) || ((plVar1->nodetype & 0x18) == 0)) ||
     ((plVar1->flags & 0x40) == 0)) {
code_r0x00117396:
    switch(local_44) {
    case LYD_DIFF_OP_CREATE:
      LVar2 = lyd_dup_single(diff_node,(lyd_node_inner *)0x0,2,&local_60);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      if (parent_node == (lyd_node *)0x0) {
        LVar2 = lyd_insert_sibling(*first_node,local_60,first_node);
      }
      else if ((local_60->flags & 8) == 0) {
        LVar2 = lyd_insert_child(parent_node,local_60);
      }
      else {
        LVar2 = lyplg_ext_insert(parent_node,local_60);
      }
      if (LVar2 != LY_SUCCESS) {
LAB_00117703:
        lyd_free_tree(local_60);
        return LVar2;
      }
      goto LAB_001177db;
    case LYD_DIFF_OP_DELETE:
      LVar2 = lyd_diff_find_match(*first_node,diff_node,'\x01',dup_inst,&local_60);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      if (local_60 != (lyd_node *)0x0) {
        if ((local_60 == *first_node) && (local_60->parent == (lyd_node_inner *)0x0)) {
          if (parent_node != (lyd_node *)0x0) {
            __assert_fail("!parent_node",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c"
                          ,0x539,
                          "LY_ERR lyd_diff_apply_r(struct lyd_node **, struct lyd_node *, const struct lyd_node *, lyd_diff_cb, void *, struct ly_ht **)"
                         );
          }
          *first_node = (*first_node)->next;
        }
        lyd_free_tree(local_60);
        return LY_SUCCESS;
      }
      break;
    case LYD_DIFF_OP_REPLACE:
      if ((plVar1->nodetype & 100) == 0) {
        pcVar9 = lys_nodetype2str(plVar1->nodetype);
        pplVar7 = &diff_node[1].schema;
        if (diff_node->schema != (lysc_node *)0x0) {
          pplVar7 = (lysc_node **)&diff_node->schema->name;
        }
        ly_log(local_50,LY_LLERR,LY_EINVAL,"Operation \"replace\" is invalid for %s node \"%s\".",
               pcVar9,*pplVar7);
        return LY_EINVAL;
      }
      LVar2 = lyd_diff_find_match(*first_node,diff_node,'\x01',dup_inst,&local_60);
      plVar5 = local_60;
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      if (local_60 != (lyd_node *)0x0) {
        if (diff_node->schema->nodetype == 4) {
          pcVar9 = lyd_get_value(diff_node);
          LVar2 = lyd_change_term(plVar5,pcVar9);
          if ((LVar2 & ~LY_EEXIST) != LY_SUCCESS) {
            __ptr = lyd_path(local_60,LYD_PATH_STD,(char *)0x0,0);
            format = "Unexpected value of node \"%s\" in %s.";
            pcVar8 = "data";
            pcVar9 = __ptr;
            goto LAB_00117791;
          }
        }
        else {
          LVar2 = lyd_any_copy_value(local_60,(lyd_any_value *)(diff_node + 1),
                                     *(LYD_ANYDATA_VALUETYPE *)&diff_node[1].schema);
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
        }
        local_60->flags = diff_node->flags;
LAB_001177db:
        if ((local_58 == (lyd_diff_cb)0x0) ||
           (LVar2 = (*local_58)(diff_node,local_60,local_40), LVar2 == LY_SUCCESS)) {
          plVar5 = lyd_child_no_keys(diff_node);
          cb_data_00 = local_40;
          diff_cb_00 = local_58;
          LVar2 = LY_SUCCESS;
          if (plVar5 != (lyd_node *)0x0) {
            do {
              first_node_00 = lyd_node_child_p(local_60);
              LVar2 = lyd_diff_apply_r(first_node_00,local_60,plVar5,diff_cb_00,cb_data_00,&local_38
                                      );
              if (LVar2 != LY_SUCCESS) break;
              plVar5 = plVar5->next;
              LVar2 = LY_SUCCESS;
            } while (plVar5 != (lyd_node *)0x0);
          }
          lyd_dup_inst_free(local_38);
        }
        return LVar2;
      }
      break;
    case LYD_DIFF_OP_NONE:
      LVar2 = lyd_diff_find_match(*first_node,diff_node,'\x01',dup_inst,&local_60);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      if (local_60 != (lyd_node *)0x0) {
        if ((local_60->schema->nodetype & 0xc) == 0) {
          plVar5 = lyd_child_no_keys(diff_node);
          if (plVar5 == (lyd_node *)0x0) {
            pplVar7 = &diff_node[1].schema;
            if (diff_node->schema != (lysc_node *)0x0) {
              pplVar7 = (lysc_node **)&diff_node->schema->name;
            }
            ly_log(local_50,LY_LLERR,LY_EINVAL,
                   "Operation \"none\" is invalid for node \"%s\" without children.",*pplVar7);
            return LY_EINVAL;
          }
        }
        else {
          if ((diff_node->flags & 1) == 0) {
            uVar6 = local_60->flags & 0xfffffffe;
          }
          else {
            uVar6 = local_60->flags | 1;
          }
          local_60->flags = uVar6;
        }
        goto LAB_001177db;
      }
      break;
    default:
      ly_log(local_50,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",0x55a);
      return LY_EINT;
    }
  }
  else {
    if (local_44 == LYD_DIFF_OP_CREATE) {
      local_48 = local_44;
      LVar2 = lyd_dup_single(diff_node,(lyd_node_inner *)0x0,2,&local_60);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
LAB_00117625:
      plVar1 = diff_node->schema;
      if (plVar1 == (lysc_node *)0x0) {
LAB_00117656:
        pcVar9 = "yang:value";
        if (plVar1->nodetype == 0x10) {
          pcVar9 = "yang:key";
        }
      }
      else {
        if (plVar1->nodetype == 8) {
          if ((plVar1->flags & 1) != 0) goto LAB_00117656;
        }
        else if ((plVar1->nodetype != 0x10) || ((plVar1->flags & 0x200) == 0)) goto LAB_00117656;
        pcVar9 = "yang:position";
      }
      plVar4 = lyd_find_meta(diff_node->meta,(lys_module *)0x0,pcVar9);
      if (plVar4 != (lyd_meta *)0x0) {
        pcVar9 = (plVar4->value)._canonical;
        if (pcVar9 == (char *)0x0) {
          pcVar9 = lyd_value_get_canonical(plVar4->annotation->module->ctx,&plVar4->value);
        }
        if (*pcVar9 == '\0') {
          pcVar9 = (char *)0x0;
        }
        LVar2 = lyd_diff_insert(first_node,parent_node,local_60,pcVar9);
        if (LVar2 != LY_SUCCESS) {
          if (local_48 != LYD_DIFF_OP_CREATE) {
            return LVar2;
          }
          goto LAB_00117703;
        }
        goto LAB_001177db;
      }
      __ptr = lyd_path(diff_node,LYD_PATH_STD,(char *)0x0,0);
      format = "Failed to find metadata \"%s\" for node \"%s\".";
      pcVar8 = __ptr;
LAB_00117791:
      ly_log(local_50,LY_LLERR,LY_EINVAL,format,pcVar9,pcVar8);
      goto LAB_00117798;
    }
    if (local_44 != LYD_DIFF_OP_REPLACE) goto code_r0x00117396;
    LVar2 = lyd_diff_find_match(*first_node,diff_node,'\x01',dup_inst,&local_60);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    local_48 = local_44;
    if (local_60 != (lyd_node *)0x0) goto LAB_00117625;
  }
  __ptr = lyd_path(diff_node,LYD_PATH_STD,(char *)0x0,0);
  ly_log(local_50,LY_LLERR,LY_EINVAL,"Failed to find node \"%s\" instance in data.",__ptr);
LAB_00117798:
  free(__ptr);
  return LY_EINVAL;
}

Assistant:

static LY_ERR
lyd_diff_apply_r(struct lyd_node **first_node, struct lyd_node *parent_node, const struct lyd_node *diff_node,
        lyd_diff_cb diff_cb, void *cb_data, struct ly_ht **dup_inst)
{
    LY_ERR ret;
    struct lyd_node *match, *diff_child;
    const char *str_val, *meta_str;
    enum lyd_diff_op op;
    struct lyd_meta *meta;
    struct ly_ht *child_dup_inst = NULL;
    const struct ly_ctx *ctx = LYD_CTX(diff_node);

    /* read all the valid attributes */
    LY_CHECK_RET(lyd_diff_get_op(diff_node, &op));

    /* handle specific user-ordered (leaf-)lists operations separately */
    if (lysc_is_userordered(diff_node->schema) && ((op == LYD_DIFF_OP_CREATE) || (op == LYD_DIFF_OP_REPLACE))) {
        if (op == LYD_DIFF_OP_REPLACE) {
            /* find the node (we must have some siblings because the node was only moved) */
            LY_CHECK_RET(lyd_diff_find_match(*first_node, diff_node, 1, dup_inst, &match));
            LY_CHECK_ERR_RET(!match, LOGERR_NOINST(ctx, diff_node), LY_EINVAL);
        } else {
            /* duplicate the node */
            LY_CHECK_RET(lyd_dup_single(diff_node, NULL, LYD_DUP_NO_META, &match));
        }

        /* get "key", "value", or "position" metadata string value */
        if (lysc_is_dup_inst_list(diff_node->schema)) {
            meta_str = "yang:position";
        } else if (diff_node->schema->nodetype == LYS_LIST) {
            meta_str = "yang:key";
        } else {
            meta_str = "yang:value";
        }
        meta = lyd_find_meta(diff_node->meta, NULL, meta_str);
        LY_CHECK_ERR_RET(!meta, LOGERR_META(ctx, meta_str, diff_node), LY_EINVAL);
        str_val = lyd_get_meta_value(meta);

        /* insert/move the node */
        if (str_val[0]) {
            ret = lyd_diff_insert(first_node, parent_node, match, str_val);
        } else {
            ret = lyd_diff_insert(first_node, parent_node, match, NULL);
        }
        if (ret) {
            if (op == LYD_DIFF_OP_CREATE) {
                lyd_free_tree(match);
            }
            return ret;
        }

        goto next_iter_r;
    }

    /* apply operation */
    switch (op) {
    case LYD_DIFF_OP_NONE:
        /* find the node */
        LY_CHECK_RET(lyd_diff_find_match(*first_node, diff_node, 1, dup_inst, &match));
        LY_CHECK_ERR_RET(!match, LOGERR_NOINST(ctx, diff_node), LY_EINVAL);

        if (match->schema->nodetype & LYD_NODE_TERM) {
            /* special case of only dflt flag change */
            if (diff_node->flags & LYD_DEFAULT) {
                match->flags |= LYD_DEFAULT;
            } else {
                match->flags &= ~LYD_DEFAULT;
            }
        } else {
            /* none operation on nodes without children is redundant and hence forbidden */
            if (!lyd_child_no_keys(diff_node)) {
                LOGERR(ctx, LY_EINVAL, "Operation \"none\" is invalid for node \"%s\" without children.",
                        LYD_NAME(diff_node));
                return LY_EINVAL;
            }
        }
        break;
    case LYD_DIFF_OP_CREATE:
        /* duplicate the node */
        LY_CHECK_RET(lyd_dup_single(diff_node, NULL, LYD_DUP_NO_META, &match));

        /* insert it at the end */
        ret = 0;
        if (parent_node) {
            if (match->flags & LYD_EXT) {
                ret = lyplg_ext_insert(parent_node, match);
            } else {
                ret = lyd_insert_child(parent_node, match);
            }
        } else {
            ret = lyd_insert_sibling(*first_node, match, first_node);
        }
        if (ret) {
            lyd_free_tree(match);
            return ret;
        }

        break;
    case LYD_DIFF_OP_DELETE:
        /* find the node */
        LY_CHECK_RET(lyd_diff_find_match(*first_node, diff_node, 1, dup_inst, &match));
        LY_CHECK_ERR_RET(!match, LOGERR_NOINST(ctx, diff_node), LY_EINVAL);

        /* remove it */
        if ((match == *first_node) && !match->parent) {
            assert(!parent_node);
            /* we have removed the top-level node */
            *first_node = (*first_node)->next;
        }
        lyd_free_tree(match);

        /* we are not going recursively in this case, the whole subtree was already deleted */
        return LY_SUCCESS;
    case LYD_DIFF_OP_REPLACE:
        if (!(diff_node->schema->nodetype & (LYS_LEAF | LYS_ANYDATA))) {
            LOGERR(ctx, LY_EINVAL, "Operation \"replace\" is invalid for %s node \"%s\".",
                    lys_nodetype2str(diff_node->schema->nodetype), LYD_NAME(diff_node));
            return LY_EINVAL;
        }

        /* find the node */
        LY_CHECK_RET(lyd_diff_find_match(*first_node, diff_node, 1, dup_inst, &match));
        LY_CHECK_ERR_RET(!match, LOGERR_NOINST(ctx, diff_node), LY_EINVAL);

        /* update the value */
        if (diff_node->schema->nodetype == LYS_LEAF) {
            ret = lyd_change_term(match, lyd_get_value(diff_node));
            LY_CHECK_ERR_RET(ret && (ret != LY_EEXIST), LOGERR_UNEXPVAL(ctx, match, "data"), LY_EINVAL);
        } else {
            struct lyd_node_any *any = (struct lyd_node_any *)diff_node;

            LY_CHECK_RET(lyd_any_copy_value(match, &any->value, any->value_type));
        }

        /* with flags */
        match->flags = diff_node->flags;
        break;
    default:
        LOGINT_RET(ctx);
    }

next_iter_r:
    if (diff_cb) {
        /* call callback */
        LY_CHECK_RET(diff_cb(diff_node, match, cb_data));
    }

    /* apply diff recursively */
    ret = LY_SUCCESS;
    LY_LIST_FOR(lyd_child_no_keys(diff_node), diff_child) {
        ret = lyd_diff_apply_r(lyd_node_child_p(match), match, diff_child, diff_cb, cb_data, &child_dup_inst);
        if (ret) {
            break;
        }
    }

    lyd_dup_inst_free(child_dup_inst);
    return ret;
}